

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

void __thiscall perfetto::Category::Category(Category *this,char *name_)

{
  char cVar1;
  int iVar2;
  NameSizes NVar3;
  char *pcVar4;
  long lVar5;
  
  iVar2 = 0;
  pcVar4 = name_;
  while( true ) {
    lVar5 = 0;
    while( true ) {
      cVar1 = pcVar4[lVar5];
      if ((cVar1 == ',') || (cVar1 == '\0')) break;
      lVar5 = lVar5 + 1;
    }
    if ((iVar2 == 1) || (cVar1 == '\0')) break;
    pcVar4 = pcVar4 + lVar5 + 1;
    iVar2 = iVar2 + 1;
  }
  pcVar4 = (char *)0x0;
  if (lVar5 == 0) {
    pcVar4 = name_;
  }
  if (iVar2 != 1) {
    pcVar4 = name_;
  }
  this->name = pcVar4;
  this->description = (char *)0x0;
  (this->tags)._M_elems[0] = (char *)0x0;
  (this->tags)._M_elems[1] = (char *)0x0;
  (this->tags)._M_elems[2] = (char *)0x0;
  (this->tags)._M_elems[3] = (char *)0x0;
  NVar3 = ComputeNameSizes(name_);
  *&(this->name_sizes_)._M_elems = NVar3._M_elems;
  return;
}

Assistant:

constexpr explicit Category(const char* name_)
      : name(CheckIsValidCategory(name_)),
        name_sizes_(ComputeNameSizes(name_)) {}